

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_169597f::HandleInsertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmMakefile *this;
  bool bVar4;
  size_type sVar5;
  const_iterator __position;
  iterator iVar6;
  value_type *__x;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  int index;
  optional<cmList> list;
  undefined1 local_98 [36];
  int local_74;
  undefined1 local_70 [24];
  ulong local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
    local_70._0_8_ = (pointer)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"sub-command INSERT requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_98._16_8_ = local_70._16_8_;
    local_98._0_8_ = local_70._0_8_;
    if ((pointer)local_70._0_8_ == (pointer)(local_70 + 0x10)) {
      return false;
    }
  }
  else {
    bVar4 = GetIndexArg(pbVar1 + 2,&local_74,status->Makefile);
    if (bVar4) {
      GetList((optional<cmList> *)local_70,pbVar1 + 1,status->Makefile);
      if (local_58._0_1_ == false) {
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = (pointer)0x0;
        local_98._16_8_ = (pointer)0x0;
        std::optional<cmList>::operator=((optional<cmList> *)local_70,(cmList *)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
      }
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      sVar5 = cmList::ComputeInsertIndex((cmList *)local_70,(long)local_74,true);
      __x = pbVar2 + 3;
      if (__x != pbVar3) {
        __position._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_70._0_8_ + sVar5 * 0x20);
        do {
          iVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70,__position,__x);
          __position._M_current = iVar6._M_current + 1;
          __x = __x + 1;
        } while (__x != pbVar3);
      }
      this = status->Makefile;
      cmList::to_string_abi_cxx11_((string *)local_98,(cmList *)local_70);
      value._M_str = (char *)local_98._0_8_;
      value._M_len = local_98._8_8_;
      cmMakefile::AddDefinition(this,pbVar1 + 1,value);
      if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
      if (local_58._0_1_ == true) {
        local_58 = local_58 & 0xffffffffffffff00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
        return true;
      }
      return true;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_70._0_8_ = (pointer)0x7;
    local_70._8_8_ = "index: ";
    local_70._16_8_ = (pointer)0x0;
    local_50 = pbVar1[2]._M_dataplus._M_p;
    local_58 = pbVar1[2]._M_string_length;
    local_48 = 0;
    local_40 = 0x15;
    local_38 = " is not a valid index";
    local_30 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_70;
    cmCatViews((string *)local_98,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_98._0_8_ == (pointer)(local_98 + 0x10)) {
      return false;
    }
  }
  operator_delete((void *)local_98._0_8_,
                  (ulong)((long)&(((pointer)local_98._16_8_)->_M_dataplus)._M_p + 1));
  return false;
}

Assistant:

bool HandleInsertCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command INSERT requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];

  // expand the variable
  int index;
  if (!GetIndexArg(args[2], &index, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  auto list = GetList(listName, status.GetMakefile());
  if (!list) {
    list = cmList{};
  }

  try {
    list->insert_items(index, args.begin() + 3, args.end(),
                       cmList::ExpandElements::No, cmList::EmptyElements::Yes);
    status.GetMakefile().AddDefinition(listName, list->to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}